

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_line.cpp
# Opt level: O3

bool __thiscall ON_Line::Transform(ON_Line *this,ON_Xform *tr)

{
  ON_3dPoint local_30;
  
  ON_Xform::operator*(&local_30,tr,&this->from);
  (this->from).z = local_30.z;
  (this->from).x = local_30.x;
  (this->from).y = local_30.y;
  ON_Xform::operator*(&local_30,tr,&this->to);
  (this->to).z = local_30.z;
  (this->to).x = local_30.x;
  (this->to).y = local_30.y;
  return true;
}

Assistant:

bool ON_Line::Transform( const ON_Xform& tr )
{
  from = tr*from;
  to = tr*to;
  // 5 June 2003 Dale Lear RR 10493
  //    Always return true.
  //return (from != to) ? true : false;
  return true;
}